

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O2

int __thiscall pstore::romfs::romfs::open(romfs *this,char *__file,int __oflag,...)

{
  error_code eVar1;
  error_code erc;
  shared_ptr<pstore::romfs::open_file> file;
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> local_60;
  undefined1 local_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  descriptor local_28;
  
  parse_path(&local_60,(romfs *)__file,___oflag);
  if (local_60.has_error_ == false) {
    error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
    value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,pstore::gsl::not_null<pstore::romfs::dirent_const*>>
              (&local_60);
    std::make_shared<pstore::romfs::open_file,pstore::romfs::dirent_const&>((dirent *)local_48);
    std::__shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2> *)
               (local_48 + 0x10),
               (__shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    local_28.f_.super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_48._16_8_;
    local_28.f_.super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = _Stack_30._M_pi;
    local_48._16_8_ = (element_type *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    error_or<pstore::romfs::descriptor>::error_or<pstore::romfs::descriptor,void>
              ((error_or<pstore::romfs::descriptor> *)this,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.f_.super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  }
  else {
    eVar1 = error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::get_error(&local_60);
    erc._M_cat = eVar1._M_cat;
    erc._4_4_ = 0;
    erc._M_value = eVar1._M_value;
    error_or<pstore::romfs::descriptor>::error_or((error_or<pstore::romfs::descriptor> *)this,erc);
  }
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::~error_or(&local_60);
  return (int)this;
}

Assistant:

auto romfs::open (not_null<czstring> const path) const -> error_or<descriptor> {
            return this->parse_path (path) >>= [] (dirent_ptr const de) {
                auto const file = std::make_shared<open_file> (*de);
                return error_or<descriptor>{descriptor{file}};
            };
        }